

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_7246::ShadowedART::assertLowerBoundValid(ShadowedART *this,Key key)

{
  art_key_chunk_t *in_RDI;
  art_iterator_t art_it;
  iterator shadow_it;
  map<(anonymous_namespace)::Key,_(anonymous_namespace)::Value,_std::less<(anonymous_namespace)::Key>,_std::allocator<std::pair<const_(anonymous_namespace)::Key,_(anonymous_namespace)::Value>_>_>
  *in_stack_ffffffffffffff48;
  art_t *in_stack_ffffffffffffff60;
  
  std::
  map<(anonymous_namespace)::Key,_(anonymous_namespace)::Value,_std::less<(anonymous_namespace)::Key>,_std::allocator<std::pair<const_(anonymous_namespace)::Key,_(anonymous_namespace)::Value>_>_>
  ::lower_bound(in_stack_ffffffffffffff48,(key_type *)0x107ea1);
  Key::data((Key *)0x107ec7);
  art_lower_bound(in_stack_ffffffffffffff60,in_RDI);
  assertIteratorValid((ShadowedART *)art_it.frames[2].node,(iterator *)art_it.frames[1]._8_8_,
                      (art_iterator_t *)art_it.frames[1].node);
  return;
}

Assistant:

void assertLowerBoundValid(Key key) {
        auto shadow_it = shadow_.lower_bound(key);
        auto art_it = art_lower_bound(&art_, key.data());
        assertIteratorValid(shadow_it, &art_it);
    }